

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12config.c
# Opt level: O0

int aom_alloc_frame_buffer
              (YV12_BUFFER_CONFIG *ybf,int width,int height,int ss_x,int ss_y,int use_highbitdepth,
              int border,int byte_alignment,_Bool alloc_pyramid,int alloc_y_plane_only)

{
  long in_RDI;
  int in_stack_00000084;
  int in_stack_0000008c;
  int in_stack_00000090;
  int in_stack_00000094;
  undefined4 in_stack_0000009c;
  int in_stack_000000e0;
  int in_stack_000000e8;
  aom_codec_frame_buffer_t *in_stack_000000f0;
  aom_get_frame_buffer_cb_fn_t in_stack_000000f8;
  void *in_stack_00000100;
  int in_stack_00000110;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 local_1c;
  
  if (in_RDI == 0) {
    local_1c = 2;
  }
  else {
    aom_free_frame_buffer
              ((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_1c = aom_realloc_frame_buffer
                         ((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_0000009c,alloc_y_plane_only),
                          in_stack_00000094,in_stack_00000090,in_stack_0000008c,byte_alignment,
                          in_stack_00000084,in_stack_000000e0,in_stack_000000e8,in_stack_000000f0,
                          in_stack_000000f8,in_stack_00000100,border._3_1_,in_stack_00000110);
  }
  return local_1c;
}

Assistant:

int aom_alloc_frame_buffer(YV12_BUFFER_CONFIG *ybf, int width, int height,
                           int ss_x, int ss_y, int use_highbitdepth, int border,
                           int byte_alignment, bool alloc_pyramid,
                           int alloc_y_plane_only) {
  if (ybf) {
    aom_free_frame_buffer(ybf);
    return aom_realloc_frame_buffer(
        ybf, width, height, ss_x, ss_y, use_highbitdepth, border,
        byte_alignment, NULL, NULL, NULL, alloc_pyramid, alloc_y_plane_only);
  }
  return AOM_CODEC_MEM_ERROR;
}